

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O0

Amap_Lib_t * Amap_LibReadBuffer(char *pBuffer,int fVerbose)

{
  Vec_Ptr_t *vTokens_00;
  Vec_Ptr_t *vTokens;
  Amap_Lib_t *pLib;
  int fVerbose_local;
  char *pBuffer_local;
  
  Amap_RemoveComments(pBuffer,(int *)0x0,(int *)0x0);
  vTokens_00 = Amap_DeriveTokens(pBuffer);
  pBuffer_local = (char *)Amap_ParseTokens(vTokens_00,fVerbose);
  if ((Amap_Lib_t *)pBuffer_local == (Amap_Lib_t *)0x0) {
    Vec_PtrFree(vTokens_00);
    pBuffer_local = (char *)0x0;
  }
  else {
    Vec_PtrFree(vTokens_00);
  }
  return (Amap_Lib_t *)pBuffer_local;
}

Assistant:

Amap_Lib_t * Amap_LibReadBuffer( char * pBuffer, int fVerbose )
{
    Amap_Lib_t * pLib;
    Vec_Ptr_t * vTokens;
    Amap_RemoveComments( pBuffer, NULL, NULL );
    vTokens = Amap_DeriveTokens( pBuffer );
    pLib = Amap_ParseTokens( vTokens, fVerbose );
    if ( pLib == NULL )
    {
        Vec_PtrFree( vTokens );
        return NULL;
    }
    Vec_PtrFree( vTokens );
    return pLib;
}